

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O2

void Ivy_ObjPatchFanout(Ivy_Man_t *p,Ivy_Obj_t *pFanin,Ivy_Obj_t *pFanoutOld,Ivy_Obj_t *pFanoutNew)

{
  Ivy_Obj_t **ppIVar1;
  
  ppIVar1 = Ivy_ObjPrevNextFanoutPlace(pFanin,pFanoutOld);
  if (*ppIVar1 != pFanoutOld) {
    __assert_fail("*ppPlace == pFanoutOld",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                  ,0xf1,
                  "void Ivy_ObjPatchFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  *ppIVar1 = pFanoutNew;
  ppIVar1 = Ivy_ObjNextPrevFanoutPlace(pFanin,pFanoutOld);
  if (ppIVar1 != (Ivy_Obj_t **)0x0) {
    if (*ppIVar1 != pFanoutOld) {
      __assert_fail("ppPlace == NULL || *ppPlace == pFanoutOld",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                    ,0xf5,
                    "void Ivy_ObjPatchFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
    }
    *ppIVar1 = pFanoutNew;
  }
  return;
}

Assistant:

void Ivy_ObjPatchFanout( Ivy_Man_t * p, Ivy_Obj_t * pFanin, Ivy_Obj_t * pFanoutOld, Ivy_Obj_t * pFanoutNew )
{
    Ivy_Obj_t ** ppPlace;
    ppPlace = Ivy_ObjPrevNextFanoutPlace(pFanin, pFanoutOld);
    assert( *ppPlace == pFanoutOld );
    if ( ppPlace )
        *ppPlace = pFanoutNew;
    ppPlace = Ivy_ObjNextPrevFanoutPlace(pFanin, pFanoutOld);
    assert( ppPlace == NULL || *ppPlace == pFanoutOld );
    if ( ppPlace )
        *ppPlace = pFanoutNew;
    // assuming that pFanoutNew already points to the next fanout
}